

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall
QString::replace(QString *this,QLatin1StringView before,QString *after,CaseSensitivity cs)

{
  long lVar1;
  QLatin1StringView str;
  qsizetype blen_00;
  qsizetype qVar2;
  QString *in_RCX;
  undefined8 in_RDX;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  qsizetype blen;
  QVarLengthArray<char16_t,_256LL> b;
  QLatin1String *in_stack_fffffffffffffd38;
  QVarLengthArray<char16_t,_256LL> *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  QLatin1Char ch;
  qsizetype in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  CaseSensitivity in_stack_fffffffffffffd7c;
  qsizetype in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined2 in_stack_fffffffffffffd8c;
  undefined1 in_stack_fffffffffffffd8e;
  undefined1 in_stack_fffffffffffffd8f;
  undefined4 in_stack_fffffffffffffd98;
  QString *local_250;
  CaseSensitivity cs_00;
  QString *in_stack_fffffffffffffde0;
  QChar in_stack_fffffffffffffe1c;
  QChar in_stack_fffffffffffffe1e;
  
  ch.ch = (char)((ulong)in_stack_fffffffffffffd48 >> 0x38);
  cs_00 = (CaseSensitivity)((ulong)in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  blen_00 = QLatin1String::size((QLatin1String *)&stack0xfffffffffffffdd0);
  if (blen_00 == 1) {
    qVar2 = size(in_RCX);
    if (qVar2 == 1) {
      QLatin1String::front(in_stack_fffffffffffffd38);
      QChar::QChar<QLatin1Char,_true>((QChar *)in_stack_fffffffffffffd40,ch);
      front((QString *)in_stack_fffffffffffffd38);
      local_250 = replace(in_stack_fffffffffffffde0,in_stack_fffffffffffffe1e,
                          in_stack_fffffffffffffe1c,cs_00);
      goto LAB_0050d3d1;
    }
  }
  memset((QVLABase<char16_t> *)&stack0xfffffffffffffde0,0xaa,0x218);
  str.m_data = in_stack_fffffffffffffd68;
  str.m_size = in_stack_fffffffffffffd60;
  qt_from_latin1_to_qvla(str);
  QVLABase<char16_t>::data((QVLABase<char16_t> *)&stack0xfffffffffffffde0);
  constData((QString *)0x50d362);
  local_250 = replace(in_RCX,(QChar *)CONCAT44(in_R8D,in_stack_fffffffffffffd98),blen_00,
                      (QChar *)CONCAT17(in_stack_fffffffffffffd8f,
                                        CONCAT16(in_stack_fffffffffffffd8e,
                                                 CONCAT24(in_stack_fffffffffffffd8c,
                                                          in_stack_fffffffffffffd88))),
                      in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(in_stack_fffffffffffffd40);
LAB_0050d3d1:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_250;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::replace(QLatin1StringView before, const QString &after, Qt::CaseSensitivity cs)
{
    const qsizetype blen = before.size();
    if (blen == 1 && after.size() == 1)
        return replace(before.front(), after.front(), cs);

    QVarLengthArray<char16_t> b = qt_from_latin1_to_qvla(before);
    return replace((const QChar *)b.data(), blen, after.constData(), after.d.size, cs);
}